

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O1

void __thiscall Assimp::MD3Importer::SetupProperties(MD3Importer *this,Importer *pImp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  int iVar3;
  string local_60;
  string local_40;
  
  uVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_MD3_KEYFRAME",-1);
  this->configFrameID = uVar2;
  if (uVar2 == 0xffffffff) {
    uVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_GLOBAL_KEYFRAME",0);
    this->configFrameID = uVar2;
  }
  iVar3 = Importer::GetPropertyInteger(pImp,"IMPORT_MD3_HANDLE_MULTIPART",1);
  this->configHandleMP = iVar3 != 0;
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"default","");
  Importer::GetPropertyString(&local_40,pImp,"IMPORT_MD3_SKIN_NAME",&local_60);
  std::__cxx11::string::_M_assign((string *)&this->configSkinFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  Importer::GetPropertyString(&local_40,pImp,"IMPORT_MD3_SHADER_SRC",&local_60);
  std::__cxx11::string::_M_assign((string *)&this->configShaderFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  iVar3 = Importer::GetPropertyInteger(pImp,"FAVOUR_SPEED",0);
  this->configSpeedFlag = iVar3 != 0;
  return;
}

Assistant:

void MD3Importer::SetupProperties(const Importer* pImp)
{
    // The
    // AI_CONFIG_IMPORT_MD3_KEYFRAME option overrides the
    // AI_CONFIG_IMPORT_GLOBAL_KEYFRAME option.
    configFrameID = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_MD3_KEYFRAME,-1);
    if(static_cast<unsigned int>(-1) == configFrameID) {
        configFrameID = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_GLOBAL_KEYFRAME,0);
    }

    // AI_CONFIG_IMPORT_MD3_HANDLE_MULTIPART
    configHandleMP = (0 != pImp->GetPropertyInteger(AI_CONFIG_IMPORT_MD3_HANDLE_MULTIPART,1));

    // AI_CONFIG_IMPORT_MD3_SKIN_NAME
    configSkinFile = (pImp->GetPropertyString(AI_CONFIG_IMPORT_MD3_SKIN_NAME,"default"));

    // AI_CONFIG_IMPORT_MD3_SHADER_SRC
    configShaderFile = (pImp->GetPropertyString(AI_CONFIG_IMPORT_MD3_SHADER_SRC,""));

    // AI_CONFIG_FAVOUR_SPEED
    configSpeedFlag = (0 != pImp->GetPropertyInteger(AI_CONFIG_FAVOUR_SPEED,0));
}